

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printProblem.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  ostream *poVar2;
  Arguments args;
  string local_270 [32];
  undefined1 local_250 [568];
  
  ArgumentHandlers::Arguments::Arguments((Arguments *)local_250);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,local_250);
  plVar1 = (long *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)local_250);
  (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb8)) + 0x170))
            (local_270,(long)plVar1 + *(long *)(*plVar1 + -0xb8));
  poVar2 = std::operator<<((ostream *)&std::cout,local_270);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string((string *)(local_250 + 0x1e8));
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try
    {

    ArgumentHandlers::Arguments args;

    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    DecPOMDPDiscreteInterface* dpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
    cout << dpomdp->SoftPrint() << endl;

    }
    catch(E& e){ e.Print(); }

    return(0);
}